

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O0

void __thiscall OpenMD::Velocitizer::removeComDrift(Velocitizer *this)

{
  Vector<double,_3U> *in_RDI;
  Thermo *in_stack_00000018;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator ioi;
  MoleculeIterator mi;
  Vector3d vdrift;
  StuntDouble *in_stack_ffffffffffffff78;
  StuntDouble *in_stack_ffffffffffffff80;
  iterator *in_stack_ffffffffffffff88;
  SimInfo *in_stack_ffffffffffffff90;
  StuntDouble *local_40;
  Molecule *local_38;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_30;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_28 [5];
  
  Thermo::getComVel(in_stack_00000018);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_28);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_30);
  local_38 = SimInfo::beginMolecule
                       (in_stack_ffffffffffffff90,(MoleculeIterator *)in_stack_ffffffffffffff88);
  while (local_38 != (Molecule *)0x0) {
    local_40 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    while (local_40 != (StuntDouble *)0x0) {
      StuntDouble::getVel(in_stack_ffffffffffffff78);
      OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffff78,in_RDI);
      Vector3<double>::Vector3((Vector3<double> *)in_RDI,(Vector<double,_3U> *)local_40);
      StuntDouble::setVel(in_stack_ffffffffffffff80,(Vector3d *)in_stack_ffffffffffffff78);
      local_40 = Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    local_38 = SimInfo::nextMolecule
                         (in_stack_ffffffffffffff90,(MoleculeIterator *)in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

void Velocitizer::removeComDrift() {
    // Get the Center of Mass drift velocity.
    Vector3d vdrift = thermo_.getComVel();

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;

    //  Corrects for the center of mass drift.
    // sums all the momentum and divides by total mass.
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        sd->setVel(sd->getVel() - vdrift);
      }
    }
  }